

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

bool_t ecpFromAJ(word *b,word *a,ec_o *ec,void *stack)

{
  size_t n;
  
  n = ec->f->n;
  wwCopy(b,a,n);
  wwCopy(b + n,a + n,ec->f->n);
  wwCopy(b + n + n,ec->f->unity,ec->f->n);
  return 1;
}

Assistant:

static bool_t ecpFromAJ(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOnA(a, ec));
	ASSERT(a == b || wwIsDisjoint2(a, 2 * n, b, 3 * n));
	// xb <- xa
	qrCopy(ecX(b), ecX(a), ec->f);
	// yb <- ya
	qrCopy(ecY(b, n), ecY(a, n), ec->f);
	// zb <- unity
	qrSetUnity(ecZ(b, n), ec->f);
	return TRUE;
}